

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link_varyings.cpp
# Opt level: O1

bool __thiscall
tfeedback_decl::assign_location(tfeedback_decl *this,gl_context *ctx,gl_shader_program *prog)

{
  char cVar1;
  anon_enum_32 aVar2;
  uint uVar3;
  tfeedback_candidate *ptVar4;
  glsl_type *pgVar5;
  glsl_type *pgVar6;
  ir_variable *piVar7;
  bool bVar8;
  byte bVar9;
  byte bVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  uint uVar14;
  
  if ((this->next_buffer_separator != false) || (this->skip_components != 0)) {
    __assert_fail("this->is_varying()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jamienicol[P]glsl-optimizer/src/compiler/glsl/link_varyings.cpp"
                  ,0x418,
                  "bool tfeedback_decl::assign_location(struct gl_context *, struct gl_shader_program *)"
                 );
  }
  ptVar4 = this->matched_candidate;
  pgVar5 = ptVar4->type;
  pgVar6 = pgVar5;
  cVar1 = pgVar5->field_0x4;
  while (cVar1 == '\x11') {
    pgVar6 = (glsl_type *)(pgVar6->fields).parameters;
    cVar1 = pgVar6->field_0x4;
  }
  bVar10 = pgVar6->field_0x4 - 4;
  bVar9 = 0;
  if (bVar10 < 10) {
    bVar9 = (byte)*(undefined4 *)(&DAT_0022ec5c + (ulong)bVar10 * 4);
  }
  uVar14 = (ptVar4->toplevel_var->data).location * 4 + ptVar4->offset +
           (*(uint *)&ptVar4->toplevel_var->data >> 0x1d & 3);
  if (pgVar5->field_0x4 != '\x11') {
    if (this->is_subscripted == true) {
      linker_error(prog,"Transform feedback varying %s requested, but %s is not an array.",
                   this->orig_name,this->var_name);
      return false;
    }
    this->size = 1;
    this->vector_elements = (uint)pgVar5->vector_elements;
    this->matrix_columns = (uint)pgVar5->matrix_columns;
    this->type = pgVar5->gl_type;
    goto LAB_001ee1f9;
  }
  aVar2 = this->lowered_builtin_array_variable;
  switch(aVar2) {
  case clip_distance:
    if (prog->last_vert_prog == (gl_program *)0x0) goto LAB_001ee17c;
    uVar12 = *(uint *)&(prog->last_vert_prog->info).field_0x76;
LAB_001ee170:
    uVar12 = uVar12 & 0xf;
    break;
  case cull_distance:
    if (prog->last_vert_prog != (gl_program *)0x0) {
      uVar12 = *(uint *)&(prog->last_vert_prog->info).field_0x76 >> 4;
      goto LAB_001ee170;
    }
LAB_001ee17c:
    uVar12 = 0;
    break;
  case tess_level_outer:
    uVar12 = 4;
    break;
  case tess_level_inner:
    uVar12 = 2;
    break;
  default:
    uVar12 = pgVar5->length;
  }
  bVar10 = ((pgVar5->fields).array)->vector_elements;
  uVar11 = (uint)((pgVar5->fields).array)->matrix_columns;
  if (this->is_subscripted == true) {
    uVar3 = this->array_subscript;
    if (uVar3 < uVar12) {
      iVar13 = bVar10 * uVar11 << (bVar9 & 0x1f);
      uVar12 = 1;
      if (aVar2 != none) {
        iVar13 = 1;
      }
      uVar14 = uVar14 + uVar3 * iVar13;
      goto LAB_001ee1b5;
    }
    bVar8 = false;
    linker_error(prog,"Transform feedback varying %s has index %i, but the array size is %u.",
                 this->orig_name,(ulong)uVar3);
  }
  else {
LAB_001ee1b5:
    this->size = uVar12;
    this->vector_elements = (uint)bVar10;
    this->matrix_columns = uVar11;
    if (aVar2 == none) {
      this->type = ((pgVar5->fields).array)->gl_type;
    }
    else {
      this->type = 0x1406;
    }
    bVar8 = true;
  }
  if (!bVar8) {
    return false;
  }
LAB_001ee1f9:
  this->location = uVar14 >> 2;
  this->location_frac = uVar14 & 3;
  if (((prog->TransformFeedback).BufferMode == 0x8c8d) &&
     (uVar14 = num_components(this), (ctx->Const).MaxTransformFeedbackSeparateComponents < uVar14))
  {
    bVar8 = false;
    linker_error(prog,
                 "Transform feedback varying %s exceeds MAX_TRANSFORM_FEEDBACK_SEPARATE_COMPONENTS."
                 ,this->orig_name);
  }
  else {
    piVar7 = this->matched_candidate->toplevel_var;
    this->stream_id = (piVar7->data).stream;
    uVar14 = this->matched_candidate->offset;
    this->buffer = (piVar7->data).xfb_buffer;
    this->offset = ((uVar14 + this->array_subscript) * 4 << (bVar9 & 0x1f)) + (piVar7->data).offset;
    bVar8 = true;
  }
  return bVar8;
}

Assistant:

bool
tfeedback_decl::assign_location(struct gl_context *ctx,
                                struct gl_shader_program *prog)
{
   assert(this->is_varying());

   unsigned fine_location
      = this->matched_candidate->toplevel_var->data.location * 4
      + this->matched_candidate->toplevel_var->data.location_frac
      + this->matched_candidate->offset;
   const unsigned dmul =
      this->matched_candidate->type->without_array()->is_64bit() ? 2 : 1;

   if (this->matched_candidate->type->is_array()) {
      /* Array variable */
      const unsigned matrix_cols =
         this->matched_candidate->type->fields.array->matrix_columns;
      const unsigned vector_elements =
         this->matched_candidate->type->fields.array->vector_elements;
      unsigned actual_array_size;
      switch (this->lowered_builtin_array_variable) {
      case clip_distance:
         actual_array_size = prog->last_vert_prog ?
            prog->last_vert_prog->info.clip_distance_array_size : 0;
         break;
      case cull_distance:
         actual_array_size = prog->last_vert_prog ?
            prog->last_vert_prog->info.cull_distance_array_size : 0;
         break;
      case tess_level_outer:
         actual_array_size = 4;
         break;
      case tess_level_inner:
         actual_array_size = 2;
         break;
      case none:
      default:
         actual_array_size = this->matched_candidate->type->array_size();
         break;
      }

      if (this->is_subscripted) {
         /* Check array bounds. */
         if (this->array_subscript >= actual_array_size) {
            linker_error(prog, "Transform feedback varying %s has index "
                         "%i, but the array size is %u.",
                         this->orig_name, this->array_subscript,
                         actual_array_size);
            return false;
         }
         unsigned array_elem_size = this->lowered_builtin_array_variable ?
            1 : vector_elements * matrix_cols * dmul;
         fine_location += array_elem_size * this->array_subscript;
         this->size = 1;
      } else {
         this->size = actual_array_size;
      }
      this->vector_elements = vector_elements;
      this->matrix_columns = matrix_cols;
      if (this->lowered_builtin_array_variable)
         this->type = GL_FLOAT;
      else
         this->type = this->matched_candidate->type->fields.array->gl_type;
   } else {
      /* Regular variable (scalar, vector, or matrix) */
      if (this->is_subscripted) {
         linker_error(prog, "Transform feedback varying %s requested, "
                      "but %s is not an array.",
                      this->orig_name, this->var_name);
         return false;
      }
      this->size = 1;
      this->vector_elements = this->matched_candidate->type->vector_elements;
      this->matrix_columns = this->matched_candidate->type->matrix_columns;
      this->type = this->matched_candidate->type->gl_type;
   }
   this->location = fine_location / 4;
   this->location_frac = fine_location % 4;

   /* From GL_EXT_transform_feedback:
    *   A program will fail to link if:
    *
    *   * the total number of components to capture in any varying
    *     variable in <varyings> is greater than the constant
    *     MAX_TRANSFORM_FEEDBACK_SEPARATE_COMPONENTS_EXT and the
    *     buffer mode is SEPARATE_ATTRIBS_EXT;
    */
   if (prog->TransformFeedback.BufferMode == GL_SEPARATE_ATTRIBS &&
       this->num_components() >
       ctx->Const.MaxTransformFeedbackSeparateComponents) {
      linker_error(prog, "Transform feedback varying %s exceeds "
                   "MAX_TRANSFORM_FEEDBACK_SEPARATE_COMPONENTS.",
                   this->orig_name);
      return false;
   }

   /* Only transform feedback varyings can be assigned to non-zero streams,
    * so assign the stream id here.
    */
   this->stream_id = this->matched_candidate->toplevel_var->data.stream;

   unsigned array_offset = this->array_subscript * 4 * dmul;
   unsigned struct_offset = this->matched_candidate->offset * 4 * dmul;
   this->buffer = this->matched_candidate->toplevel_var->data.xfb_buffer;
   this->offset = this->matched_candidate->toplevel_var->data.offset +
      array_offset + struct_offset;

   return true;
}